

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

void __thiscall Material::removeVec3Uniform(Material *this,string *uniformName)

{
  bool bVar1;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
  local_20;
  iterator it;
  string *uniformName_local;
  Material *this_local;
  
  it._M_node = (_Base_ptr)uniformName;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
             ::find(&this->vec3Uniforms,uniformName);
  local_20._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
       ::end(&this->vec3Uniforms);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    std::
    map<std::__cxx11::string,glm::tvec3<float,(glm::precision)0>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glm::tvec3<float,(glm::precision)0>*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,glm::tvec3<float,(glm::precision)0>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glm::tvec3<float,(glm::precision)0>*>>>
                        *)&this->vec3Uniforms,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void Material::removeVec3Uniform(std::string uniformName)
{
	std::map<std::string, glm::vec3*>::iterator it;
	it = vec3Uniforms.find(uniformName);
	if (it != vec3Uniforms.end())
	{
		vec3Uniforms.erase(it);
	}
}